

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O1

double msen(jas_matrix_t *x,jas_matrix_t *y,int n)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  lVar1 = x->numrows_;
  if (lVar1 < 1) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      if (0 < x->numcols_) {
        if (1 < n - 1U) {
          abort();
        }
        lVar2 = 0;
        do {
          dVar5 = (double)(y->rows_[lVar3][lVar2] - x->rows_[lVar3][lVar2]);
          if (n == 1) {
            dVar5 = ABS(dVar5);
          }
          else {
            dVar5 = dVar5 * dVar5;
          }
          dVar4 = dVar4 + dVar5;
          lVar2 = lVar2 + 1;
        } while (x->numcols_ != lVar2);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != lVar1);
  }
  return dVar4 / ((double)x->numcols_ * (double)lVar1);
}

Assistant:

double msen(jas_matrix_t *x, jas_matrix_t *y, int n)
{
	double s;
	double d;

	s = 0.0;
	for (jas_matind_t i = 0; i < jas_matrix_numrows(x); i++) {
		for (jas_matind_t j = 0; j < jas_matrix_numcols(x); j++) {
			d = jas_matrix_get(y, i, j) - jas_matrix_get(x, i, j);
			if (n == 1) {
				s += fabs(d);
			} else if (n == 2) {
				s += d * d;
			} else {
				abort();
			}
		}
	}

	return s / ((double) jas_matrix_numrows(x) * jas_matrix_numcols(x));
}